

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void printKVDataJSON(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen,ktx_uint32_t base_indent,
                    ktx_uint32_t indent_width,_Bool minified)

{
  byte *pbVar1;
  uint uVar2;
  uint *puVar3;
  _Bool _Var4;
  ktx_error_code_e kVar5;
  uint uVar6;
  int iVar7;
  ktxHashList This;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  undefined7 in_register_00000081;
  char *pcVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  ktx_uint32_t valueLen;
  char *key;
  char *value;
  ktxHashList kvDataHead;
  ktx_uint32_t keyLen;
  uint local_74;
  uint8_t *local_70;
  uint8_t *local_68;
  char *local_60;
  uint *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  ktxHashList local_40;
  uint local_34;
  
  puVar13 = " ";
  bVar16 = (int)CONCAT71(in_register_00000081,minified) != 0;
  if (bVar16) {
    puVar13 = "";
  }
  local_70 = "\n";
  if (bVar16) {
    local_70 = "";
  }
  local_40 = (ktxHashListEntry *)0x0;
  if ((pKvd == (ktx_uint8_t *)0x0) || (kvdLen == 0)) {
    __assert_fail("pKvd != NULL && kvdLen > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0xf2,
                  "void printKVDataJSON(ktx_uint8_t *, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, _Bool)"
                 );
  }
  kVar5 = ktxHashList_Deserialize(&local_40,kvdLen,pKvd);
  if (local_40 != (ktxHashListEntry *)0x0 && kVar5 == KTX_SUCCESS) {
    uVar6 = indent_width * base_indent;
    local_44 = (base_indent + 1) * indent_width;
    bVar16 = true;
    This = local_40;
    uVar14 = 0;
    local_68 = puVar13;
    do {
      ktxHashListEntry_GetKey(This,&local_34,&local_60);
      ktxHashListEntry_GetValue(This,&local_74,&local_58);
      puVar3 = local_58;
      pcVar11 = local_60;
      if (local_58 == (uint *)0x0) {
        _Var4 = isKnownKeyValue(local_60);
        if (!_Var4) {
          if (!bVar16) {
            fprintf(_stdout,",%s",local_70);
          }
          bVar16 = false;
          printf("%*s\"%s\":%snull",(ulong)uVar6,"",local_60,puVar13);
        }
      }
      else {
        iVar7 = strcmp(local_60,"KTXglFormat");
        if (iVar7 == 0) {
          if (local_74 == 0xc) {
            if (!bVar16) {
              fprintf(_stdout,",%s",local_70);
            }
            puVar13 = local_68;
            puVar10 = local_70;
            uVar2 = *local_58;
            local_4c = local_58[1];
            local_48 = local_58[2];
            printf("%*s\"%s\":%s{%s",(ulong)uVar6,"",local_60,local_68,local_70);
            uVar12 = local_44;
            printf("%*s\"glInternalformat\":%s%u,%s",(ulong)local_44,"",puVar13,(ulong)uVar2,puVar10
                  );
            printf("%*s\"glFormat\":%s%u,%s",(ulong)uVar12,"",puVar13,(ulong)local_4c,puVar10);
            pcVar11 = "%*s\"glType\":%s%u%s";
LAB_001ec4e6:
            printf(pcVar11,(ulong)uVar12,"",puVar13,(ulong)local_48,puVar10);
LAB_001ec505:
            bVar16 = false;
            printf("%*s}",(ulong)uVar6,"");
          }
        }
        else {
          iVar7 = strcmp(pcVar11,"KTXanimData");
          if (iVar7 == 0) {
            if (local_74 == 0xc) {
              if (!bVar16) {
                fprintf(_stdout,",%s",local_70);
              }
              puVar13 = local_68;
              puVar10 = local_70;
              uVar2 = *local_58;
              local_4c = local_58[1];
              local_48 = local_58[2];
              printf("%*s\"%s\":%s{%s",(ulong)uVar6,"",local_60,local_68,local_70);
              uVar12 = local_44;
              printf("%*s\"duration\":%s%u,%s",(ulong)local_44,"",puVar13,(ulong)uVar2,puVar10);
              printf("%*s\"timescale\":%s%u,%s",(ulong)uVar12,"",puVar13,(ulong)local_4c,puVar10);
              pcVar11 = "%*s\"loopCount\":%s%u%s";
              goto LAB_001ec4e6;
            }
          }
          else {
            iVar7 = strcmp(pcVar11,"KTXcubemapIncomplete");
            if (iVar7 == 0) {
              if (local_74 == 1) {
                if (!bVar16) {
                  fprintf(_stdout,",%s",local_70);
                }
                puVar10 = local_70;
                uVar2 = *local_58;
                printf("%*s\"%s\":%s{%s",(ulong)uVar6,"",local_60,puVar13,local_70);
                uVar12 = local_44;
                pcVar11 = "true";
                if ((uVar2 & 1) == 0) {
                  pcVar11 = "false";
                }
                printf("%*s\"positiveX\":%s%s,%s",(ulong)local_44,"",local_68,pcVar11,puVar10);
                pcVar11 = "true";
                if ((uVar2 & 2) == 0) {
                  pcVar11 = "false";
                }
                printf("%*s\"negativeX\":%s%s,%s",(ulong)uVar12,"",local_68,pcVar11,puVar10);
                pcVar11 = "true";
                if ((uVar2 & 4) == 0) {
                  pcVar11 = "false";
                }
                printf("%*s\"positiveY\":%s%s,%s",(ulong)uVar12,"",local_68,pcVar11,puVar10);
                pcVar11 = "true";
                if ((uVar2 & 8) == 0) {
                  pcVar11 = "false";
                }
                printf("%*s\"negativeY\":%s%s,%s",(ulong)uVar12,"",local_68,pcVar11,puVar10);
                pcVar11 = "true";
                if ((uVar2 & 0x10) == 0) {
                  pcVar11 = "false";
                }
                printf("%*s\"positiveZ\":%s%s,%s",(ulong)uVar12,"",local_68,pcVar11,puVar10);
                puVar13 = local_68;
                pcVar11 = "true";
                if ((uVar2 & 0x20) == 0) {
                  pcVar11 = "false";
                }
                printf("%*s\"negativeZ\":%s%s%s",(ulong)uVar12,"",local_68,pcVar11,puVar10);
                goto LAB_001ec505;
              }
            }
            else {
              _Var4 = isKnownKeyValueUINT32(pcVar11);
              if (_Var4) {
                if (local_74 == 4) {
                  if (!bVar16) {
                    fprintf(_stdout,",%s",local_70);
                  }
                  bVar16 = false;
                  printf("%*s\"%s\":%s%u",(ulong)uVar6,"",local_60,puVar13,(ulong)*local_58);
                }
              }
              else {
                _Var4 = isKnownKeyValueString(pcVar11);
                if (_Var4) {
                  if (*(byte *)((long)puVar3 + (ulong)(local_74 - 1)) == 0) {
                    if (!bVar16) {
                      fprintf(_stdout,",%s",local_70);
                    }
                    bVar16 = false;
                    printf("%*s\"%s\":%s\"%s\"",(ulong)uVar6,"",local_60,puVar13,local_58);
                  }
                }
                else {
                  if (!bVar16) {
                    fprintf(_stdout,",%s",local_70);
                  }
                  printf("%*s\"%s\":%s[",(ulong)uVar6,"",local_60,puVar13);
                  uVar8 = (ulong)local_74;
                  if (local_74 != 0) {
                    uVar9 = 0;
                    do {
                      pbVar1 = (byte *)((long)local_58 + uVar9);
                      uVar9 = uVar9 + 1;
                      puVar13 = ", ";
                      if (uVar9 == uVar8) {
                        puVar13 = "";
                      }
                      fprintf(_stdout,"%d%s",(ulong)(uint)(int)(char)*pbVar1,puVar13);
                      uVar8 = (ulong)local_74;
                    } while (uVar9 < uVar8);
                  }
                  fputc(0x5d,_stdout);
                  bVar16 = false;
                  puVar13 = local_68;
                }
              }
            }
          }
        }
      }
      This = ktxHashList_Next(This);
    } while ((This != (ktxHashListEntry *)0x0) &&
            (bVar15 = uVar14 < 99, uVar14 = uVar14 + 1, bVar15));
    fputs((char *)local_70,_stdout);
    ktxHashList_Destruct(&local_40);
  }
  return;
}

Assistant:

void
printKVDataJSON(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    const char* space = minified ? "" : " ";
    const char* nl = minified ? "" : "\n";

    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        // Logging while printing JSON is not possible, we rely on the validation step to provide meaningful errors
        // fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    bool firstPrint = true; // Marks if the first print did not occur yet (first print != first entry)
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        if (!value) {
            if (!isKnownKeyValue(key)) {
                // Known keys are not be printed with null
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%snull", key, space)
            }
        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"glInternalformat\":%s%u,%s", space, glInternalformat, nl)
                    PRINT_INDENT(1, "\"glFormat\":%s%u,%s", space, glFormat, nl)
                    PRINT_INDENT(1, "\"glType\":%s%u%s", space, glType, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"duration\":%s%u,%s", space, duration, nl)
                    PRINT_INDENT(1, "\"timescale\":%s%u,%s", space, timescale, nl)
                    PRINT_INDENT(1, "\"loopCount\":%s%u%s", space, loopCount, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint8_t faces = *value;
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"positiveX\":%s%s,%s", space, faces & 1u << 0u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeX\":%s%s,%s", space, faces & 1u << 1u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveY\":%s%s,%s", space, faces & 1u << 2u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeY\":%s%s,%s", space, faces & 1u << 3u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveZ\":%s%s,%s", space, faces & 1u << 4u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeZ\":%s%s%s", space, faces & 1u << 5u ? "true" : "false", nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    PRINT_INDENT(0, "\"%s\":%s%u", key, space, number)
                }
            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    PRINT_INDENT(0, "\"%s\":%s\"%s\"", key, space, value)
                }
            } else {
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%s[", key, space)
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]");
            }
        }
    }
    fprintf(stdout, "%s", nl);

    ktxHashList_Destruct(&kvDataHead);
}